

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O1

UBool dayPeriodRulesCleanup_63(void)

{
  void *in_RSI;
  
  if (*(UMemory **)(icu_63::(anonymous_namespace)::data + 8) != (UMemory *)0x0) {
    icu_63::UMemory::operator_delete__
              (*(UMemory **)(icu_63::(anonymous_namespace)::data + 8),in_RSI);
  }
  uhash_close_63(*(UHashtable **)icu_63::(anonymous_namespace)::data);
  if (icu_63::(anonymous_namespace)::data != (UMemory *)0x0) {
    icu_63::UMemory::operator_delete(icu_63::(anonymous_namespace)::data,in_RSI);
  }
  icu_63::(anonymous_namespace)::data = (UMemory *)0x0;
  return '\x01';
}

Assistant:

U_CFUNC UBool U_CALLCONV dayPeriodRulesCleanup() {
    delete[] data->rules;
    uhash_close(data->localeToRuleSetNumMap);
    delete data;
    data = NULL;
    return TRUE;
}